

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

FlowEdge * __thiscall
FlowGraph::FindEdge(FlowGraph *this,BasicBlock *predBlock,BasicBlock *succBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *ppFVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pSVar5 = &(predBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_40 = (undefined1  [8])pSVar5;
  __iter.list = pSVar5;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    if (pSVar5 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pSVar5 = __iter.list;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                   &pSVar5->super_SListNodeBase<Memory::ArenaAllocator>)->
                  super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) break;
    ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    pSVar5 = __iter.list;
    if ((*ppFVar4)->succBlock == succBlock) {
      return *ppFVar4;
    }
  }
  return (FlowEdge *)0x0;
}

Assistant:

FlowEdge *
FlowGraph::FindEdge(BasicBlock *predBlock, BasicBlock *succBlock)
{
        FlowEdge *srcEdge = nullptr;
        FOREACH_SUCCESSOR_EDGE(edge, predBlock)
        {
            if (edge->GetSucc() == succBlock)
            {
                srcEdge = edge;
                break;
            }
        } NEXT_SUCCESSOR_EDGE;

        return srcEdge;
}